

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int lookup1_values(int entries,int dim)

{
  int iVar1;
  int iVar2;
  float fVar3;
  double dVar4;
  double __y;
  
  fVar3 = logf((float)entries);
  fVar3 = expf(fVar3 / (float)dim);
  fVar3 = floorf(fVar3);
  __y = (double)dim;
  dVar4 = pow((double)((float)(int)fVar3 + 1.0),__y);
  dVar4 = floor(dVar4);
  iVar2 = (uint)((int)dVar4 <= entries) + (int)fVar3;
  dVar4 = pow((double)((float)iVar2 + 1.0),__y);
  iVar1 = -1;
  if ((double)entries < dVar4) {
    dVar4 = pow((double)iVar2,__y);
    dVar4 = floor(dVar4);
    iVar1 = iVar2;
    if (entries < (int)dVar4) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int lookup1_values(int entries, int dim)
{
   int r = (int) floor(exp((float) log((float) entries) / dim));
   if ((int) floor(pow((float) r+1, dim)) <= entries)   // (int) cast for MinGW warning;
      ++r;                                              // floor() to avoid _ftol() when non-CRT
   if (pow((float) r+1, dim) <= entries)
      return -1;
   if ((int) floor(pow((float) r, dim)) > entries)
      return -1;
   return r;
}